

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

leveldb_filterpolicy_t * leveldb_filterpolicy_create_bloom(int bits_per_key)

{
  leveldb_filterpolicy_t *plVar1;
  FilterPolicy *pFVar2;
  
  plVar1 = (leveldb_filterpolicy_t *)operator_new(0x38);
  (plVar1->super_FilterPolicy)._vptr_FilterPolicy = (_func_int **)&PTR__Wrapper_001340f0;
  pFVar2 = leveldb::NewBloomFilterPolicy(bits_per_key);
  plVar1[1].super_FilterPolicy._vptr_FilterPolicy = (_func_int **)pFVar2;
  plVar1->state_ = (void *)0x0;
  plVar1->destructor_ = leveldb_filterpolicy_create_bloom::Wrapper::DoNothing;
  return plVar1;
}

Assistant:

leveldb_filterpolicy_t* leveldb_filterpolicy_create_bloom(int bits_per_key) {
  // Make a leveldb_filterpolicy_t, but override all of its methods so
  // they delegate to a NewBloomFilterPolicy() instead of user
  // supplied C functions.
  struct Wrapper : public leveldb_filterpolicy_t {
    static void DoNothing(void*) {}

    ~Wrapper() { delete rep_; }
    const char* Name() const { return rep_->Name(); }
    void CreateFilter(const Slice* keys, int n, std::string* dst) const {
      return rep_->CreateFilter(keys, n, dst);
    }
    bool KeyMayMatch(const Slice& key, const Slice& filter) const {
      return rep_->KeyMayMatch(key, filter);
    }

    const FilterPolicy* rep_;
  };
  Wrapper* wrapper = new Wrapper;
  wrapper->rep_ = NewBloomFilterPolicy(bits_per_key);
  wrapper->state_ = nullptr;
  wrapper->destructor_ = &Wrapper::DoNothing;
  return wrapper;
}